

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnRt4CopyPalCommand::Execute
          (DrawColumnRt4CopyPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint8_t *puVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint8_t *puVar8;
  int iVar9;
  
  iVar9 = (this->super_PalRtCommand).yl;
  uVar3 = ((this->super_PalRtCommand).yh - iVar9) + 1;
  uVar6 = thread->pass_end_y - iVar9;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  if ((int)uVar3 < (int)uVar6) {
    uVar6 = uVar3;
  }
  iVar1 = thread->num_cores;
  uVar3 = thread->pass_start_y - iVar9;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  iVar5 = (iVar1 - (int)((iVar9 + uVar3) - thread->core) % iVar1) % iVar1;
  uVar2 = (long)(int)((~uVar3 + iVar1 + uVar6) - iVar5) / (long)iVar1;
  if (0 < (int)uVar2) {
    iVar5 = iVar9 + uVar3 + iVar5;
    puVar8 = (this->super_PalRtCommand)._destorg +
             (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar5];
    puVar4 = thread->dc_temp + (iVar5 / iVar1 << 2);
    iVar9 = iVar1 * (this->super_PalRtCommand)._pitch >> 2;
    if ((uVar2 & 1) != 0) {
      *(undefined4 *)puVar8 = *(undefined4 *)puVar4;
      puVar4 = puVar4 + 4;
      puVar8 = puVar8 + (long)iVar9 * 4;
    }
    if ((int)uVar2 != 1) {
      lVar7 = 0;
      do {
        *(undefined4 *)puVar8 = *(undefined4 *)(puVar4 + lVar7 * 8);
        *(undefined4 *)(puVar8 + (long)iVar9 * 4) = *(undefined4 *)(puVar4 + lVar7 * 8 + 4);
        puVar8 = puVar8 + (long)(iVar9 * 2) * 4;
        lVar7 = lVar7 + 1;
      } while ((int)((uVar2 & 0xffffffff) >> 1) != (int)lVar7);
    }
  }
  return;
}

Assistant:

void DrawColumnRt4CopyPalCommand::Execute(DrawerThread *thread)
	{
		int *source;
		int *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		dest = (int *)(ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg);
		source = (int *)(&thread->dc_temp[thread->temp_line_for_thread(yl)*4]);
		pitch = _pitch*thread->num_cores/sizeof(int);
	
		if (count & 1) {
			*dest = *source;
			source += 4/sizeof(int);
			dest += pitch;
		}
		if (!(count >>= 1))
			return;

		do {
			dest[0] = source[0];
			dest[pitch] = source[4/sizeof(int)];
			source += 8/sizeof(int);
			dest += pitch*2;
		} while (--count);
	}